

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

int Cec_ManResimulateCounterExamples(Cec_ManSim_t *pSim,Vec_Int_t *vCexStore,int nFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  int local_38;
  uint local_34;
  int iStart;
  int RetValue;
  Vec_Ptr_t *vSimInfo;
  Vec_Int_t *vPairs;
  int nFrames_local;
  Vec_Int_t *vCexStore_local;
  Cec_ManSim_t *pSim_local;
  
  local_34 = 0;
  local_38 = 0;
  p = Gia_ManCorrCreateRemapping(pSim->pAig);
  Gia_ManCreateValueRefs(pSim->pAig);
  pSim->pPars->nFrames = nFrames;
  iVar1 = Gia_ManRegNum(pSim->pAig);
  iVar2 = Gia_ManPiNum(pSim->pAig);
  p_00 = Vec_PtrAllocSimInfo(iVar1 + iVar2 * nFrames,pSim->pPars->nWords);
  while( true ) {
    iVar1 = Vec_IntSize(vCexStore);
    if (iVar1 <= local_38) break;
    iVar1 = Gia_ManRegNum(pSim->pAig);
    Cec_ManStartSimInfo(p_00,iVar1);
    local_38 = Cec_ManLoadCounterExamples(p_00,vCexStore,local_38);
    Gia_ManCorrPerformRemapping(p,p_00);
    uVar3 = Cec_ManSeqResimulate(pSim,p_00);
    local_34 = uVar3 | local_34;
  }
  iVar1 = Vec_IntSize(vCexStore);
  if (local_38 == iVar1) {
    Vec_PtrFree(p_00);
    Vec_IntFree(p);
    return local_34;
  }
  __assert_fail("iStart == Vec_IntSize(vCexStore)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                ,0x236,"int Cec_ManResimulateCounterExamples(Cec_ManSim_t *, Vec_Int_t *, int)");
}

Assistant:

int Cec_ManResimulateCounterExamples( Cec_ManSim_t * pSim, Vec_Int_t * vCexStore, int nFrames )
{ 
    Vec_Int_t * vPairs;
    Vec_Ptr_t * vSimInfo; 
    int RetValue = 0, iStart = 0;
    vPairs = Gia_ManCorrCreateRemapping( pSim->pAig );
    Gia_ManCreateValueRefs( pSim->pAig );
//    pSim->pPars->nWords  = 63;
    pSim->pPars->nFrames = nFrames;
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pSim->pAig) + Gia_ManPiNum(pSim->pAig) * nFrames, pSim->pPars->nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        Cec_ManStartSimInfo( vSimInfo, Gia_ManRegNum(pSim->pAig) );
        iStart = Cec_ManLoadCounterExamples( vSimInfo, vCexStore, iStart );
//        iStart = Cec_ManLoadCounterExamples2( vSimInfo, vCexStore, iStart );
//        Gia_ManCorrRemapSimInfo( pSim->pAig, vSimInfo );
        Gia_ManCorrPerformRemapping( vPairs, vSimInfo );
        RetValue |= Cec_ManSeqResimulate( pSim, vSimInfo );
//        Cec_ManSeqResimulateInfo( pSim->pAig, vSimInfo, NULL );
    }
//Gia_ManEquivPrintOne( pSim->pAig, 85, 0 );
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_PtrFree( vSimInfo );
    Vec_IntFree( vPairs );
    return RetValue;
}